

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O1

void __thiscall
toktxApp::genMipmap(toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage,
                   uint32_t layer,uint32_t faceSlice,ktxTexture *texture)

{
  Image *pIVar1;
  PFNKTEXSETIMAGEFROMMEMORY p_Var2;
  uint uVar3;
  ktx_error_code_e kVar4;
  ktx_uint8_t *pkVar5;
  ktx_size_t kVar6;
  uint uVar7;
  pointer __old_p;
  long *plVar8;
  long *plVar9;
  ktx_uint32_t kVar10;
  stringstream message;
  long *local_1b8 [49];
  
  if (texture->numLevels < 2) {
    plVar9 = (long *)0x0;
  }
  else {
    kVar10 = 1;
    plVar8 = (long *)0x0;
    do {
      pIVar1 = (pImage->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      uVar7 = pIVar1->width >> ((byte)kVar10 & 0x1f);
      uVar3 = pIVar1->height >> ((byte)kVar10 & 0x1f);
      (*pIVar1->_vptr_Image[0x11])
                ((this->options).gmopts.filterScale,local_1b8,pIVar1,(ulong)(uVar7 + (uVar7 == 0)),
                 (ulong)(uVar3 + (uVar3 == 0)),(this->options).gmopts.filter._M_dataplus._M_p,
                 (ulong)(this->options).gmopts.wrapMode);
      plVar9 = local_1b8[0];
      local_1b8[0] = (long *)0x0;
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
      if (local_1b8[0] != (long *)0x0) {
        (**(code **)(*local_1b8[0] + 8))();
      }
      if ((this->options).super_commandOptions.normalize == true) {
        (**(code **)(*plVar9 + 0xa0))(plVar9);
      }
      p_Var2 = texture->vtbl->SetImageFromMemory;
      pkVar5 = (ktx_uint8_t *)(**(code **)(*plVar9 + 0x10))(plVar9);
      kVar6 = (**(code **)(*plVar9 + 0x18))(plVar9);
      kVar4 = (*p_Var2)(texture,kVar10,layer,faceSlice,pkVar5,kVar6);
      if (kVar4 != KTX_SUCCESS) {
        __assert_fail("ret == KTX_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x4dc,
                      "void toktxApp::genMipmap(unique_ptr<Image>, uint32_t, uint32_t, ktxTexture *)"
                     );
      }
      kVar10 = kVar10 + 1;
      plVar8 = plVar9;
    } while (kVar10 < texture->numLevels);
  }
  if (plVar9 != (long *)0x0) {
    (**(code **)(*plVar9 + 8))(plVar9);
  }
  return;
}

Assistant:

void
toktxApp::genMipmap(unique_ptr<Image> pImage,
                    uint32_t layer, uint32_t faceSlice,
                    ktxTexture* texture)
{
    unique_ptr<Image> levelImage;
    for (uint32_t glevel = 1; glevel < texture->numLevels; glevel++) {
        auto levelWidth = maximum<uint32_t>(1, pImage->getWidth() >> glevel);
        auto levelHeight = maximum<uint32_t>(1, pImage->getHeight() >> glevel);
        try {
            levelImage = pImage->resample(levelWidth, levelHeight,
                                    options.gmopts.filter.c_str(),
                                    options.gmopts.filterScale,
                                    options.gmopts.wrapMode);
        } catch (runtime_error& e) {
            stringstream message;
            message << "Image::resample() failed! " << e.what();
            cant_create_image(message.str());
        }

        if (options.normalize)
            levelImage->normalize();

        MAYBE_UNUSED ktx_error_code_e ret;
        ret = ktxTexture_SetImageFromMemory(texture,
                                      glevel,
                                      layer,
                                      faceSlice,
                                      *levelImage,
                                      levelImage->getByteCount());
        assert(ret == KTX_SUCCESS);
    }
}